

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_> *
__thiscall Catch::clara::detail::Opt::getHelpColumns(Opt *this)

{
  initializer_list<Catch::clara::detail::HelpColumns> __l;
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  long in_RSI;
  vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
  *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *opt;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  bool first;
  ostringstream oss;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd68;
  HelpColumns *in_stack_fffffffffffffd70;
  allocator_type *in_stack_fffffffffffffd98;
  undefined1 ***pppuVar4;
  vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
  *in_stack_fffffffffffffda0;
  undefined1 ***pppuVar5;
  iterator pHVar6;
  undefined8 **ppuVar7;
  undefined1 local_219 [9];
  undefined8 *local_210 [4];
  string local_1f0 [32];
  undefined1 **local_1d0;
  undefined8 local_1c8;
  reference local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a0;
  long local_198;
  byte local_189;
  ostringstream local_188 [392];
  
  ::std::__cxx11::ostringstream::ostringstream(local_188);
  local_189 = 1;
  local_198 = in_RSI + 0x60;
  local_1a0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(in_stack_fffffffffffffd68);
  local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(in_stack_fffffffffffffd68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffd70,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffd68);
    if (!bVar1) break;
    local_1b0 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_1a0);
    if ((local_189 & 1) == 0) {
      ::std::operator<<((ostream *)local_188,", ");
    }
    else {
      local_189 = 0;
    }
    ::std::operator<<((ostream *)local_188,(string *)local_1b0);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_1a0);
  }
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    poVar3 = ::std::operator<<((ostream *)local_188," <");
    poVar3 = ::std::operator<<(poVar3,(string *)(in_RSI + 0x20));
    ::std::operator<<(poVar3,">");
  }
  ppuVar7 = local_210;
  local_219._1_8_ = ppuVar7;
  ::std::__cxx11::ostringstream::str();
  ::std::__cxx11::string::string(local_1f0,(string *)(in_RSI + 0x40));
  local_1d0 = (undefined1 **)local_210;
  local_1c8 = 1;
  pHVar6 = (iterator)local_219;
  std::allocator<Catch::clara::detail::HelpColumns>::allocator
            ((allocator<Catch::clara::detail::HelpColumns> *)0x193f67);
  __l._M_len = (size_type)ppuVar7;
  __l._M_array = pHVar6;
  std::vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
  ::vector(in_stack_fffffffffffffda0,__l,in_stack_fffffffffffffd98);
  std::allocator<Catch::clara::detail::HelpColumns>::~allocator
            ((allocator<Catch::clara::detail::HelpColumns> *)0x193f92);
  pppuVar4 = (undefined1 ***)local_210;
  pppuVar5 = &local_1d0;
  do {
    pppuVar5 = pppuVar5 + -8;
    HelpColumns::~HelpColumns(in_stack_fffffffffffffd70);
  } while (pppuVar5 != pppuVar4);
  ::std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

auto getHelpColumns() const -> std::vector<HelpColumns> {
            std::ostringstream oss;
            bool first = true;
            for( auto const &opt : m_optNames ) {
                if (first)
                    first = false;
                else
                    oss << ", ";
                oss << opt;
            }
            if( !m_hint.empty() )
                oss << " <" << m_hint << ">";
            return { { oss.str(), m_description } };
        }